

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cross_product.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::CrossProductExecutor::Execute(CrossProductExecutor *this,DataChunk *input,DataChunk *output)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  OperatorResultType OVar4;
  byte bVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  size_type sVar9;
  DataChunk *pDVar10;
  long lVar11;
  
  if (this->rhs->count == 0) {
    OVar4 = FINISHED;
  }
  else {
    bVar3 = NextValue(this,input,output);
    if (bVar3) {
      bVar5 = this->scan_input_chunk;
      pDVar10 = input;
      if ((bool)bVar5 != false) {
        pDVar10 = &this->scan_chunk;
      }
      pVVar1 = (pDVar10->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (pDVar10->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((bool)bVar5 == true) {
        lVar8 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      }
      else {
        lVar8 = 0;
      }
      output->count = pDVar10->count;
      if (pVVar2 != pVVar1) {
        lVar11 = ((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
        sVar9 = 0;
        do {
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&output->data,lVar8 + sVar9);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar10->data,sVar9);
          Vector::Reference(pvVar6,pvVar7);
          sVar9 = sVar9 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != sVar9);
        bVar5 = this->scan_input_chunk;
      }
      pDVar10 = &this->scan_chunk;
      if ((bVar5 & 1) != 0) {
        pDVar10 = input;
      }
      pVVar1 = (pDVar10->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (pDVar10->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((bVar5 & 1) == 0) {
        lVar8 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      }
      else {
        lVar8 = 0;
      }
      OVar4 = HAVE_MORE_OUTPUT;
      if (pVVar2 != pVVar1) {
        lVar11 = ((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
        sVar9 = 0;
        do {
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&output->data,lVar8 + sVar9);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar10->data,sVar9);
          ConstantVector::Reference(pvVar6,pvVar7,this->position_in_chunk,pDVar10->count);
          sVar9 = sVar9 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != sVar9);
        OVar4 = HAVE_MORE_OUTPUT;
      }
    }
    else {
      this->initialized = false;
      OVar4 = NEED_MORE_INPUT;
    }
  }
  return OVar4;
}

Assistant:

OperatorResultType CrossProductExecutor::Execute(DataChunk &input, DataChunk &output) {
	if (rhs.Count() == 0) {
		// no RHS: empty result
		return OperatorResultType::FINISHED;
	}
	if (!NextValue(input, output)) {
		// ran out of entries on the RHS
		// reset the RHS and move to the next chunk on the LHS
		initialized = false;
		return OperatorResultType::NEED_MORE_INPUT;
	}

	// set up the constant chunk
	auto &constant_chunk = scan_input_chunk ? scan_chunk : input;
	auto col_count = constant_chunk.ColumnCount();
	auto col_offset = scan_input_chunk ? input.ColumnCount() : 0;
	output.SetCardinality(constant_chunk.size());
	for (idx_t i = 0; i < col_count; i++) {
		output.data[col_offset + i].Reference(constant_chunk.data[i]);
	}

	// for the chunk that we are scanning, scan a single value from that chunk
	auto &scan = scan_input_chunk ? input : scan_chunk;
	col_count = scan.ColumnCount();
	col_offset = scan_input_chunk ? 0 : input.ColumnCount();
	for (idx_t i = 0; i < col_count; i++) {
		ConstantVector::Reference(output.data[col_offset + i], scan.data[i], position_in_chunk, scan.size());
	}
	return OperatorResultType::HAVE_MORE_OUTPUT;
}